

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Extractor::input(Extractor *this,int blob_index,Mat *in)

{
  size_type sVar1;
  int in_ESI;
  Mat *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  
  if ((-1 < in_ESI) &&
     (iVar2 = in_ESI,
     sVar1 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&in_RDI->refcount),
     iVar2 < (int)sVar1)) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&in_RDI->refcount,(long)in_ESI);
    Mat::operator=(in_RDI,(Mat *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    return 0;
  }
  return -1;
}

Assistant:

int Extractor::input(int blob_index, const Mat& in)
{
    if (blob_index < 0 || blob_index >= (int)blob_mats.size())
        return -1;

    blob_mats[blob_index] = in;

    return 0;
}